

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)103,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Ea<(moira::Mode)5,_(moira::Size)2> src;
  Ea<(moira::Mode)5,_(moira::Size)2> local_24;
  
  local_24.reg = op & 7;
  local_24.pc = *addr;
  *addr = local_24.pc + 2;
  local_24.ext1 = (*this->_vptr_Moira[5])();
  local_24.ext1 = local_24.ext1 & 0xffff;
  pcVar4 = "seq";
  if (str->upper != false) {
    pcVar4 = "SEQ";
  }
  cVar1 = *pcVar4;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar1;
    cVar1 = *pcVar4;
  }
  iVar2 = (this->tab).raw;
  while (pcVar4 = str->ptr, pcVar4 < str->base + iVar2) {
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,&local_24);
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src;
}